

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ec_curve * ec_p256(void)

{
  mp_int *p_00;
  mp_int *a_00;
  mp_int *b_00;
  mp_int *G_x_00;
  mp_int *G_y_00;
  mp_int *G_order_00;
  mp_int *nonsquare;
  mp_int *nonsquare_mod_p;
  mp_int *G_order;
  mp_int *G_y;
  mp_int *G_x;
  mp_int *b;
  mp_int *a;
  mp_int *p;
  
  if (!ec_p256::initialised) {
    p_00 = mp__from_string_literal
                     ("0xffffffff00000001000000000000000000000000ffffffffffffffffffffffff");
    a_00 = mp__from_string_literal
                     ("0xffffffff00000001000000000000000000000000fffffffffffffffffffffffc");
    b_00 = mp__from_string_literal
                     ("0x5ac635d8aa3a93e7b3ebbd55769886bc651d06b0cc53b0f63bce3c3e27d2604b");
    G_x_00 = mp__from_string_literal
                       ("0x6b17d1f2e12c4247f8bce6e563a440f277037d812deb33a0f4a13945d898c296");
    G_y_00 = mp__from_string_literal
                       ("0x4fe342e2fe1a7f9b8ee7eb4a7c0f9e162bce33576b315ececbb6406837bf51f5");
    G_order_00 = mp__from_string_literal
                           ("0xffffffff00000000ffffffffffffffffbce6faada7179e84f3b9cac2fc632551");
    nonsquare = mp_from_integer(3);
    initialise_wcurve(&ec_p256::curve,p_00,a_00,b_00,nonsquare,G_x_00,G_y_00,G_order_00);
    mp_free(p_00);
    mp_free(a_00);
    mp_free(b_00);
    mp_free(G_x_00);
    mp_free(G_y_00);
    mp_free(G_order_00);
    mp_free(nonsquare);
    ec_p256::curve.name = "nistp256";
    ec_p256::curve.textname = "nistp256";
    ec_p256::initialised = true;
  }
  return &ec_p256::curve;
}

Assistant:

static struct ec_curve *ec_p256(void)
{
    static struct ec_curve curve = { 0 };
    static bool initialised = false;

    if (!initialised)
    {
        mp_int *p = MP_LITERAL(0xffffffff00000001000000000000000000000000ffffffffffffffffffffffff);
        mp_int *a = MP_LITERAL(0xffffffff00000001000000000000000000000000fffffffffffffffffffffffc);
        mp_int *b = MP_LITERAL(0x5ac635d8aa3a93e7b3ebbd55769886bc651d06b0cc53b0f63bce3c3e27d2604b);
        mp_int *G_x = MP_LITERAL(0x6b17d1f2e12c4247f8bce6e563a440f277037d812deb33a0f4a13945d898c296);
        mp_int *G_y = MP_LITERAL(0x4fe342e2fe1a7f9b8ee7eb4a7c0f9e162bce33576b315ececbb6406837bf51f5);
        mp_int *G_order = MP_LITERAL(0xffffffff00000000ffffffffffffffffbce6faada7179e84f3b9cac2fc632551);
        mp_int *nonsquare_mod_p = mp_from_integer(3);
        initialise_wcurve(&curve, p, a, b, nonsquare_mod_p, G_x, G_y, G_order);
        mp_free(p);
        mp_free(a);
        mp_free(b);
        mp_free(G_x);
        mp_free(G_y);
        mp_free(G_order);
        mp_free(nonsquare_mod_p);

        curve.textname = curve.name = "nistp256";

        /* Now initialised, no need to do it again */
        initialised = true;
    }

    return &curve;
}